

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

var cs_impl::runtime_cs_ext::await_s(var *func,array *args)

{
  initializer_list<cs_impl::any> __l;
  bool bVar1;
  proxy *in_RDI;
  undefined1 *puVar2;
  object_method *om;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_fffffffffffffe28;
  async_callable *in_stack_fffffffffffffe30;
  type_info *in_stack_fffffffffffffe38;
  type_info *in_stack_fffffffffffffe40;
  vector *in_stack_fffffffffffffe50;
  allocator_type *in_stack_fffffffffffffe58;
  async_callable *in_stack_fffffffffffffe60;
  undefined1 *puVar3;
  iterator in_stack_fffffffffffffe68;
  async_callable *in_stack_fffffffffffffe88;
  async_callable *func_00;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*>
  *in_stack_fffffffffffffeb0;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*>
  *in_stack_fffffffffffffeb8;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_fffffffffffffec0;
  array *append_args;
  vector *data;
  var *in_stack_fffffffffffffed8;
  async_callable *in_stack_fffffffffffffee0;
  async_callable local_90 [2];
  
  any::type((any *)in_stack_fffffffffffffe30);
  bVar1 = std::type_info::operator==(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  if (bVar1) {
    func_00 = local_90;
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::begin(in_stack_fffffffffffffe28);
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::end(in_stack_fffffffffffffe28);
    std::allocator<cs_impl::any>::allocator((allocator<cs_impl::any> *)0x270507);
    std::vector<cs_impl::any,std::allocator<cs_impl::any>>::
    vector<std::_Deque_iterator<cs_impl::any,cs_impl::any_const&,cs_impl::any_const*>,void>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
               (allocator_type *)in_RDI);
    async_callable::async_callable
              (in_stack_fffffffffffffe60,(var *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50)
    ;
    fiber::await<cs_impl::runtime_cs_ext::async_callable>(func_00);
    async_callable::~async_callable(in_stack_fffffffffffffe30);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector
              ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffe40);
    std::allocator<cs_impl::any>::~allocator((allocator<cs_impl::any> *)0x27057c);
  }
  else {
    any::type((any *)in_stack_fffffffffffffe30);
    bVar1 = std::type_info::operator==(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    if (bVar1) {
      any::const_val<cs::object_method>((any *)in_stack_fffffffffffffeb0);
      any::any((any *)in_stack_fffffffffffffe30,(any *)in_stack_fffffffffffffe28);
      append_args = (array *)&stack0xfffffffffffffec0;
      data = (vector *)0x1;
      puVar3 = &stack0xfffffffffffffeb7;
      std::allocator<cs_impl::any>::allocator((allocator<cs_impl::any> *)0x270685);
      __l._M_len = (size_type)puVar3;
      __l._M_array = in_stack_fffffffffffffe68;
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
                ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffe60,
                 __l,in_stack_fffffffffffffe58);
      async_callable::async_callable
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,data,append_args);
      fiber::await<cs_impl::runtime_cs_ext::async_callable>(in_stack_fffffffffffffe88);
      async_callable::~async_callable(in_stack_fffffffffffffe30);
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector
                ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffe40);
      std::allocator<cs_impl::any>::~allocator((allocator<cs_impl::any> *)0x270708);
      puVar3 = &stack0xfffffffffffffec0;
      puVar2 = &stack0xfffffffffffffec8;
      do {
        puVar2 = puVar2 + -8;
        any::~any((any *)0x270731);
      } while (puVar2 != puVar3);
    }
    else {
      any::any<cs::pointer>((any *)in_stack_fffffffffffffe40,(pointer *)in_stack_fffffffffffffe38);
    }
  }
  return (var)in_RDI;
}

Assistant:

var await_s(const var &func, const array &args)
		{
			if (func.type() == typeid(callable)) {
				return fiber::await(async_callable(func, vector(args.begin(), args.end())));
			}
			else if (func.type() == typeid(object_method)) {
				const auto &om = func.const_val<object_method>();
				return fiber::await(async_callable(om.callable, {om.object}, args));
			}
			return null_pointer;
		}